

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

bool __thiscall
QGraphicsScenePrivate::dispatchHoverEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneHoverEvent *hoverEvent)

{
  QList<QGraphicsItem_*> *this_00;
  QGraphicsItem **ppQVar1;
  bool bVar2;
  bool bVar3;
  QWidget *widget;
  QGraphicsScenePrivate *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItem *pQVar6;
  qsizetype qVar7;
  value_type item;
  int iVar8;
  long lVar9;
  QGraphicsScenePrivate *pQVar10;
  int iVar11;
  long lVar12;
  QGraphicsScenePrivate *item_00;
  long in_FS_OFFSET;
  QPointF QVar13;
  QPointF local_70;
  QPoint local_60;
  undefined1 local_58 [8];
  QGraphicsItem **ppQStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0xb9 & 0x10) != 0) {
    bVar2 = false;
    goto LAB_0059949f;
  }
  lVar9 = (this->cachedItemsUnderMouse).d.size;
  pQVar4 = this;
  if (lVar9 == 0) {
    local_60 = QGraphicsSceneHoverEvent::screenPos(hoverEvent);
    QVar13 = QGraphicsSceneHoverEvent::scenePos(hoverEvent);
    local_70.yp = QVar13.yp;
    local_70.xp = QVar13.xp;
    widget = QGraphicsSceneEvent::widget(&hoverEvent->super_QGraphicsSceneEvent);
    pQVar4 = (QGraphicsScenePrivate *)local_58;
    itemsAtPosition((QList<QGraphicsItem_*> *)pQVar4,this,&local_60,&local_70,widget);
    QArrayDataPointer<QGraphicsItem_*>::operator=
              (&(this->cachedItemsUnderMouse).d,(QArrayDataPointer<QGraphicsItem_*> *)pQVar4);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
              ((QArrayDataPointer<QGraphicsItem_*> *)pQVar4);
    lVar9 = (this->cachedItemsUnderMouse).d.size;
  }
  ppQVar1 = (this->cachedItemsUnderMouse).d.ptr;
  lVar12 = 0;
  do {
    if (lVar9 * 8 == lVar12) goto LAB_0059932b;
    item_00 = *(QGraphicsScenePrivate **)((long)ppQVar1 + lVar12);
    bVar2 = itemAcceptsHoverEvents_helper(pQVar4,(QGraphicsItem *)item_00);
    lVar12 = lVar12 + 8;
  } while (!bVar2);
  if (item_00 == (QGraphicsScenePrivate *)0x0) {
LAB_0059932b:
    bVar2 = true;
    item_00 = (QGraphicsScenePrivate *)0x0;
    local_70.xp = (qreal)pQVar4;
LAB_00599335:
    pQVar4 = (QGraphicsScenePrivate *)0x0;
  }
  else {
    lVar9 = (this->hoverItems).d.size;
    if (lVar9 == 0) {
      bVar2 = false;
      local_70.xp = (qreal)pQVar4;
      goto LAB_00599335;
    }
    pQVar10 = item_00;
    pQVar4 = (QGraphicsScenePrivate *)
             QGraphicsItem::commonAncestorItem
                       ((QGraphicsItem *)item_00,(this->hoverItems).d.ptr[lVar9 + -1]);
    bVar2 = false;
    local_70.xp = (qreal)pQVar10;
  }
  iVar11 = -1;
  while (pQVar4 != (QGraphicsScenePrivate *)0x0) {
    pQVar10 = (QGraphicsScenePrivate *)local_70.xp;
    local_70.xp = (qreal)pQVar4;
    bVar3 = itemAcceptsHoverEvents_helper(pQVar10,(QGraphicsItem *)pQVar4);
    if (bVar3) {
      pQVar4 = (QGraphicsScenePrivate *)local_70.xp;
      if ((QGraphicsScenePrivate *)local_70.xp != (QGraphicsScenePrivate *)0x0) {
        pQVar5 = QGraphicsItem::panel((QGraphicsItem *)local_70.xp);
        pQVar6 = QGraphicsItem::panel((QGraphicsItem *)item_00);
        if (pQVar5 == pQVar6) {
          qVar7 = QtPrivate::indexOf<QGraphicsItem*,QGraphicsItem*>
                            (&this->hoverItems,(QGraphicsItem **)&local_70,0);
          iVar11 = (int)qVar7;
          pQVar4 = (QGraphicsScenePrivate *)local_70.xp;
        }
        else {
          local_70.xp = 0.0;
          pQVar4 = (QGraphicsScenePrivate *)local_70.xp;
        }
      }
      break;
    }
    pQVar4 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)local_70.xp);
  }
  local_70.xp = (qreal)pQVar4;
  this_00 = &this->hoverItems;
  iVar8 = (int)(this->hoverItems).d.size;
  while (iVar8 = iVar8 + -1, iVar11 < iVar8) {
    pQVar4 = (QGraphicsScenePrivate *)this_00;
    item = QList<QGraphicsItem_*>::takeLast(this_00);
    bVar3 = itemAcceptsHoverEvents_helper(pQVar4,item);
    if (bVar3) {
      sendHoverEvent(this,GraphicsSceneHoverLeave,item,hoverEvent);
    }
  }
  local_58 = (undefined1  [8])0x0;
  ppQStack_50 = (QGraphicsItem **)0x0;
  local_48 = 0;
  for (pQVar4 = item_00;
      (pQVar4 != (QGraphicsScenePrivate *)0x0 && (pQVar4 != (QGraphicsScenePrivate *)local_70.xp));
      pQVar4 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)pQVar4)) {
    QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)local_58,(parameter_type)pQVar4);
    bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)pQVar4);
    if (bVar3) break;
  }
  ppQVar1 = ppQStack_50;
  for (lVar9 = local_48 << 3; lVar9 != 0; lVar9 = lVar9 + -8) {
    pQVar5 = *(QGraphicsItem **)((long)ppQVar1 + lVar9 + -8);
    pQVar4 = (QGraphicsScenePrivate *)this_00;
    QList<QGraphicsItem_*>::append(this_00,pQVar5);
    bVar3 = itemAcceptsHoverEvents_helper(pQVar4,pQVar5);
    if (bVar3) {
      sendHoverEvent(this,GraphicsSceneHoverEnter,pQVar5,hoverEvent);
    }
  }
  if (((bVar2) || (lVar9 = (this->hoverItems).d.size, lVar9 == 0)) ||
     (item_00 != (QGraphicsScenePrivate *)(this->hoverItems).d.ptr[lVar9 + -1])) {
    bVar2 = false;
  }
  else {
    sendHoverEvent(this,GraphicsSceneHoverMove,(QGraphicsItem *)item_00,hoverEvent);
    bVar2 = true;
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QGraphicsItem_*> *)local_58);
LAB_0059949f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScenePrivate::dispatchHoverEvent(QGraphicsSceneHoverEvent *hoverEvent)
{
    if (allItemsIgnoreHoverEvents)
        return false;

    // Find the first item that accepts hover events, reusing earlier
    // calculated data is possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(hoverEvent->screenPos(),
                                                hoverEvent->scenePos(),
                                                hoverEvent->widget());
    }

    QGraphicsItem *item = nullptr;
    for (auto tmp : std::as_const(cachedItemsUnderMouse)) {
        if (itemAcceptsHoverEvents_helper(tmp)) {
            item = tmp;
            break;
        }
    }

    // Find the common ancestor item for the new topmost hoverItem and the
    // last item in the hoverItem list.
    QGraphicsItem *commonAncestorItem = (item && !hoverItems.isEmpty()) ? item->commonAncestorItem(hoverItems.constLast()) : nullptr;
    while (commonAncestorItem && !itemAcceptsHoverEvents_helper(commonAncestorItem))
        commonAncestorItem = commonAncestorItem->parentItem();
    if (commonAncestorItem && commonAncestorItem->panel() != item->panel()) {
        // The common ancestor isn't in the same panel as the two hovered
        // items.
        commonAncestorItem = nullptr;
    }

    // Check if the common ancestor item is known.
    int index = commonAncestorItem ? hoverItems.indexOf(commonAncestorItem) : -1;
    // Send hover leaves to any existing hovered children of the common
    // ancestor item.
    for (int i = hoverItems.size() - 1; i > index; --i) {
        QGraphicsItem *lastItem = hoverItems.takeLast();
        if (itemAcceptsHoverEvents_helper(lastItem))
            sendHoverEvent(QEvent::GraphicsSceneHoverLeave, lastItem, hoverEvent);
    }

    // Item is a child of a known item. Generate enter events for the
    // missing links.
    QList<QGraphicsItem *> parents;
    QGraphicsItem *parent = item;
    while (parent && parent != commonAncestorItem) {
        parents.append(parent);
        if (parent->isPanel()) {
            // Stop at the panel - we don't deliver beyond this point.
            break;
        }
        parent = parent->parentItem();
    }
    for (auto it = parents.crbegin(), end = parents.crend(); it != end; ++it) {
        QGraphicsItem *parent = *it;
        hoverItems << parent;
        if (itemAcceptsHoverEvents_helper(parent))
            sendHoverEvent(QEvent::GraphicsSceneHoverEnter, parent, hoverEvent);
    }

    // Generate a move event for the item itself
    if (item
        && !hoverItems.isEmpty()
        && item == hoverItems.constLast()) {
        sendHoverEvent(QEvent::GraphicsSceneHoverMove, item, hoverEvent);
        return true;
    }
    return false;
}